

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O0

void MatrixMultiply(Matrix m1,Matrix m2,Matrix prod)

{
  double local_38;
  double sum;
  int local_28;
  int k;
  int j;
  int i;
  Matrix prod_local;
  Matrix m2_local;
  Matrix m1_local;
  
  if (*(char *)((long)m1 + -6) != *(char *)((long)m2 + -7)) {
    Am_Error("MatrixMultiply");
  }
  if ((*(char *)((long)prod + -7) == *(char *)((long)m1 + -7)) &&
     (*(char *)((long)prod + -6) == *(char *)((long)m2 + -6))) {
    for (k = 0; k < (int)(uint)*(byte *)((long)m1 + -7); k = k + 1) {
      for (local_28 = 0; local_28 < (int)(uint)*(byte *)((long)m2 + -6); local_28 = local_28 + 1) {
        local_38 = 0.0;
        for (sum._4_4_ = 0; sum._4_4_ < (int)(uint)*(byte *)((long)m1 + -6);
            sum._4_4_ = sum._4_4_ + 1) {
          local_38 = m1[k][sum._4_4_] * m2[sum._4_4_][local_28] + local_38;
        }
        prod[k][local_28] = local_38;
      }
    }
    return;
  }
  Am_Error("MatrixMultiply");
}

Assistant:

void
MatrixMultiply(Matrix m1, Matrix m2, Matrix prod)
{
  int i, j, k;
  double sum;

  if (NCOLS(m1) != NROWS(m2))
    Am_Error("MatrixMultiply"); //: Can't multiply %dx%d and %dx%d matrices",
  //NROWS(m1), NCOLS(m1), NROWS(m2), NCOLS(m2));
  if (NROWS(prod) != NROWS(m1) || NCOLS(prod) != NCOLS(m2))
    Am_Error(
        "MatrixMultiply"); //: %dx%d times %dx%d does not give %dx%d product",
  //NROWS(m1), NCOLS(m1), NROWS(m2), NCOLS(m2),
  //NROWS(prod), NCOLS(prod));

  for (i = 0; i < NROWS(m1); i++)
    for (j = 0; j < NCOLS(m2); j++) {
      sum = 0;
      for (k = 0; k < NCOLS(m1); k++)
        sum += m1[i][k] * m2[k][j];
      prod[i][j] = sum;
    }
}